

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TextureCubeMapArraySubImage3D::iterate(TextureCubeMapArraySubImage3D *this)

{
  uint width_00;
  undefined1 local_40 [8];
  SubImage3DCopyParams copy_params;
  GLuint depth;
  GLuint height;
  GLuint width;
  GLuint resolution_index;
  GLuint storage_index;
  GLboolean test_passed;
  TextureCubeMapArraySubImage3D *this_local;
  
  _storage_index = this;
  initTest(this);
  resolution_index._3_1_ = '\x01';
  for (width = 0; width < 2; width = width + 1) {
    for (height = 0; height < 4; height = height + 1) {
      width_00 = *(uint *)(resolutions + (ulong)height * 0xc);
      copy_params.m_depth = *(GLuint *)(resolutions + (ulong)height * 0xc + 4);
      copy_params.m_height = *(GLuint *)(resolutions + (ulong)height * 0xc + 8);
      configureCubeMapArrayTexture(this,width_00,copy_params.m_depth,copy_params.m_height,width,0);
      SubImage3DCopyParams::SubImage3DCopyParams((SubImage3DCopyParams *)local_40);
      SubImage3DCopyParams::init((SubImage3DCopyParams *)local_40,(EVP_PKEY_CTX *)0x0);
      configureDataBuffer(this,width_00,copy_params.m_depth,copy_params.m_height,
                          (SubImage3DCopyParams *)local_40,0);
      configurePixelUnpackBuffer(this,(SubImage3DCopyParams *)local_40);
      configure2DTexture(this,(SubImage3DCopyParams *)local_40);
      testTexSubImage3D(this,width_00,copy_params.m_depth,copy_params.m_height,
                        (SubImage3DCopyParams *)local_40,(GLboolean *)((long)&resolution_index + 3))
      ;
      testCopyTexSubImage3D
                (this,width_00,copy_params.m_depth,copy_params.m_height,
                 (SubImage3DCopyParams *)local_40,(GLboolean *)((long)&resolution_index + 3));
      deletePixelUnpackBuffer(this);
      delete2DTexture(this);
      SubImage3DCopyParams::init
                ((SubImage3DCopyParams *)local_40,(EVP_PKEY_CTX *)(ulong)(width_00 >> 1));
      configureDataBuffer(this,width_00,copy_params.m_depth,copy_params.m_height,
                          (SubImage3DCopyParams *)local_40,0);
      configurePixelUnpackBuffer(this,(SubImage3DCopyParams *)local_40);
      configure2DTexture(this,(SubImage3DCopyParams *)local_40);
      testTexSubImage3D(this,width_00,copy_params.m_depth,copy_params.m_height,
                        (SubImage3DCopyParams *)local_40,(GLboolean *)((long)&resolution_index + 3))
      ;
      testCopyTexSubImage3D
                (this,width_00,copy_params.m_depth,copy_params.m_height,
                 (SubImage3DCopyParams *)local_40,(GLboolean *)((long)&resolution_index + 3));
      deletePixelUnpackBuffer(this);
      delete2DTexture(this);
      SubImage3DCopyParams::init((SubImage3DCopyParams *)local_40,(EVP_PKEY_CTX *)0x0);
      configureDataBuffer(this,width_00,copy_params.m_depth,copy_params.m_height,
                          (SubImage3DCopyParams *)local_40,0);
      configurePixelUnpackBuffer(this,(SubImage3DCopyParams *)local_40);
      testTexSubImage3D(this,width_00,copy_params.m_depth,copy_params.m_height,
                        (SubImage3DCopyParams *)local_40,(GLboolean *)((long)&resolution_index + 3))
      ;
      deletePixelUnpackBuffer(this);
      SubImage3DCopyParams::init((SubImage3DCopyParams *)local_40,(EVP_PKEY_CTX *)0x0);
      configureDataBuffer(this,width_00,copy_params.m_depth,copy_params.m_height,
                          (SubImage3DCopyParams *)local_40,0);
      configurePixelUnpackBuffer(this,(SubImage3DCopyParams *)local_40);
      testTexSubImage3D(this,width_00,copy_params.m_depth,copy_params.m_height,
                        (SubImage3DCopyParams *)local_40,(GLboolean *)((long)&resolution_index + 3))
      ;
      deletePixelUnpackBuffer(this);
      SubImage3DCopyParams::init
                ((SubImage3DCopyParams *)local_40,(EVP_PKEY_CTX *)(ulong)(width_00 >> 1));
      configureDataBuffer(this,width_00,copy_params.m_depth,copy_params.m_height,
                          (SubImage3DCopyParams *)local_40,0);
      configurePixelUnpackBuffer(this,(SubImage3DCopyParams *)local_40);
      testTexSubImage3D(this,width_00,copy_params.m_depth,copy_params.m_height,
                        (SubImage3DCopyParams *)local_40,(GLboolean *)((long)&resolution_index + 3))
      ;
      deletePixelUnpackBuffer(this);
      SubImage3DCopyParams::init
                ((SubImage3DCopyParams *)local_40,(EVP_PKEY_CTX *)(ulong)(width_00 >> 1));
      configureDataBuffer(this,width_00,copy_params.m_depth,copy_params.m_height,
                          (SubImage3DCopyParams *)local_40,0);
      configurePixelUnpackBuffer(this,(SubImage3DCopyParams *)local_40);
      testTexSubImage3D(this,width_00,copy_params.m_depth,copy_params.m_height,
                        (SubImage3DCopyParams *)local_40,(GLboolean *)((long)&resolution_index + 3))
      ;
      deletePixelUnpackBuffer(this);
      deleteCubeMapArrayTexture(this);
    }
  }
  if (resolution_index._3_1_ == '\0') {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult TextureCubeMapArraySubImage3D::iterate()
{
	initTest();

	glw::GLboolean test_passed = true;

	/* Execute test throught all storage types */
	for (glw::GLuint storage_index = 0; storage_index < m_n_storage_type; ++storage_index)
	{
		/* Execute test throught all texture resolutions */
		for (glw::GLuint resolution_index = 0; resolution_index < m_n_resolutions; ++resolution_index)
		{
			glw::GLuint width  = resolutions[resolution_index][DL_WIDTH];
			glw::GLuint height = resolutions[resolution_index][DL_HEIGHT];
			glw::GLuint depth  = resolutions[resolution_index][DL_DEPTH];

			configureCubeMapArrayTexture(width, height, depth, static_cast<STORAGE_TYPE>(storage_index), 0);

			/* A single whole layer-face at index 0 should be replaced (both functions) */
			SubImage3DCopyParams copy_params;
			copy_params.init(0, 0, 0, width, height, 1);

			configureDataBuffer(width, height, depth, copy_params, 0);
			configurePixelUnpackBuffer(copy_params);
			configure2DTexture(copy_params);
			testTexSubImage3D(width, height, depth, copy_params, test_passed);
			testCopyTexSubImage3D(width, height, depth, copy_params, test_passed);
			deletePixelUnpackBuffer();
			delete2DTexture();

			/* A region of a layer-face at index 0 should be replaced (both functions) */
			copy_params.init(width / 2, height / 2, 0, width / 2, height / 2, 1);

			configureDataBuffer(width, height, depth, copy_params, 0);
			configurePixelUnpackBuffer(copy_params);
			configure2DTexture(copy_params);
			testTexSubImage3D(width, height, depth, copy_params, test_passed);
			testCopyTexSubImage3D(width, height, depth, copy_params, test_passed);
			deletePixelUnpackBuffer();
			delete2DTexture();

			/* 6 layer-faces, making up a single layer, should be replaced (glTexSubImage3D() only) */
			copy_params.init(0, 0, 0, width, height, 6);

			configureDataBuffer(width, height, depth, copy_params, 0);
			configurePixelUnpackBuffer(copy_params);
			testTexSubImage3D(width, height, depth, copy_params, test_passed);
			deletePixelUnpackBuffer();

			/* 6 layer-faces, making up two different layers (for instance: three last layer-faces of
			 layer 1 and three first layer-faces of layer 2) should be replaced (glTexSubImage3D() only) */
			copy_params.init(0, 0, 3, width, height, 6);

			configureDataBuffer(width, height, depth, copy_params, 0);
			configurePixelUnpackBuffer(copy_params);
			testTexSubImage3D(width, height, depth, copy_params, test_passed);
			deletePixelUnpackBuffer();

			/* 6 layer-faces, making up a single layer, should be replaced (glTexSubImage3D() only),
			 but limited to a quad */
			copy_params.init(width / 2, height / 2, 0, width / 2, height / 2, 6);

			configureDataBuffer(width, height, depth, copy_params, 0);
			configurePixelUnpackBuffer(copy_params);
			testTexSubImage3D(width, height, depth, copy_params, test_passed);
			deletePixelUnpackBuffer();

			/* 6 layer-faces, making up two different layers (for instance: three last layer-faces of
			 layer 1 and three first layer-faces of layer 2) should be replaced (glTexSubImage3D() only),
			 but limited to a quad */
			copy_params.init(width / 2, height / 2, 3, width / 2, height / 2, 6);

			configureDataBuffer(width, height, depth, copy_params, 0);
			configurePixelUnpackBuffer(copy_params);
			testTexSubImage3D(width, height, depth, copy_params, test_passed);
			deletePixelUnpackBuffer();

			deleteCubeMapArrayTexture();
		}
	}

	if (test_passed)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

	return STOP;
}